

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O0

Chunk * __thiscall riffcpp::Chunk::operator=(Chunk *this,Chunk *lhs)

{
  impl *piVar1;
  impl *piVar2;
  Chunk *lhs_local;
  Chunk *this_local;
  
  std::shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>_>::operator=
            (&this->pimpl->m_buf,&lhs->pimpl->m_buf);
  std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>::operator=
            (&this->pimpl->m_stream,&lhs->pimpl->m_stream);
  piVar1 = lhs->pimpl;
  piVar2 = this->pimpl;
  (piVar2->m_pos)._M_off = (piVar1->m_pos)._M_off;
  (piVar2->m_pos)._M_state = (piVar1->m_pos)._M_state;
  piVar1 = lhs->pimpl;
  piVar2 = this->pimpl;
  (piVar2->m_limit)._M_off = (piVar1->m_limit)._M_off;
  (piVar2->m_limit)._M_state = (piVar1->m_limit)._M_state;
  *(undefined4 *)(this->pimpl->m_id)._M_elems = *(undefined4 *)(lhs->pimpl->m_id)._M_elems;
  this->pimpl->m_size = lhs->pimpl->m_size;
  return this;
}

Assistant:

riffcpp::Chunk &riffcpp::Chunk::operator=(const riffcpp::Chunk &lhs) {
  pimpl->m_buf = lhs.pimpl->m_buf;
  pimpl->m_stream = lhs.pimpl->m_stream;
  pimpl->m_pos = lhs.pimpl->m_pos;
  pimpl->m_limit = lhs.pimpl->m_limit;
  pimpl->m_id = lhs.pimpl->m_id;
  pimpl->m_size = lhs.pimpl->m_size;
  return *this;
}